

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void initialize_imputer<InputData<float,long>,long_double>
               (Imputer *imputer,InputData<float,_long> *input_data,size_t ntrees,int nthreads)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  reference pvVar7;
  reference pvVar8;
  long *in_RSI;
  long *in_RDI;
  size_t row_1;
  size_t col_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cat_counts;
  long ix;
  size_t col_1;
  size_t row;
  size_t col;
  size_t cnt;
  size_t offset;
  undefined4 in_stack_fffffffffffffe48;
  value_type in_stack_fffffffffffffe4c;
  int *in_stack_fffffffffffffe50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar9;
  undefined6 uStack_178;
  byte local_161;
  float local_160;
  byte local_145;
  float local_144;
  ulong local_e8;
  ulong local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  long local_78;
  undefined8 local_40;
  undefined4 local_34;
  double *local_30;
  double *local_28;
  long *local_10;
  long *local_8;
  
  *in_RDI = in_RSI[1];
  in_RDI[1] = in_RSI[5];
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<int,std::allocator<int>>::assign<int*,void>
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_current,
             (int *)in_stack_fffffffffffffe58._M_current,in_stack_fffffffffffffe50);
  sVar5 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(local_8 + 8));
  if (sVar5 == 0) {
    local_40 = 0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,(value_type_conflict *)in_stack_fffffffffffffe70);
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_28 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_30 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_34 = 0;
    std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>::allocator
            ((allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_> *)0x5432a1);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
           (allocator_type *)in_stack_fffffffffffffe60._M_current);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::operator=((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
               *)in_stack_fffffffffffffe60._M_current,
              (vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
               *)in_stack_fffffffffffffe58._M_current);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             *)in_stack_fffffffffffffe60._M_current);
  std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>::~allocator
            ((allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_> *)0x5432f0);
  if (*local_10 == 0) {
    if (local_10[0xd] != 0) {
      for (local_98 = 0; local_98 < (ulong)local_10[1]; local_98 = local_98 + 1) {
        local_80 = local_10[6];
        for (local_a0 = *(long *)(local_10[0xd] + local_98 * 8);
            local_a0 < *(long *)(local_10[0xd] + 8 + local_98 * 8); local_a0 = local_a0 + 1) {
          uVar3 = std::isnan((double)(ulong)*(uint *)(local_10[0xb] + local_a0 * 4));
          if (((uVar3 & 1) == 0) &&
             (uVar3 = std::isinf((double)(ulong)*(uint *)(local_10[0xb] + local_a0 * 4)),
             (uVar3 & 1) == 0)) {
            local_160 = *(float *)(local_10[0xb] + local_a0 * 4);
          }
          else {
            local_160 = 0.0;
          }
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_8 + 8),local_98);
          *pvVar6 = (double)local_160 + *pvVar6;
          uVar3 = std::isnan((double)(ulong)*(uint *)(local_10[0xb] + local_a0 * 4));
          local_161 = 1;
          if ((uVar3 & 1) == 0) {
            iVar4 = std::isinf((double)(ulong)*(uint *)(local_10[0xb] + local_a0 * 4));
            local_161 = (byte)iVar4;
          }
          local_80 = local_80 - (ulong)(local_161 & 1);
        }
        uVar9 = SUB104((longdouble)(float)(&DAT_006c0110)[local_80 < 0] + (longdouble)local_80,0);
        uStack_178 = (undefined6)
                     ((unkuint10)
                      ((longdouble)(float)(&DAT_006c0110)[local_80 < 0] + (longdouble)local_80) >>
                     0x20);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 8),local_98);
        *pvVar6 = (double)((longdouble)*pvVar6 / (longdouble)CONCAT64(uStack_178,uVar9));
        if (local_80 == 0) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_8 + 8),local_98);
          *pvVar6 = NAN;
        }
      }
    }
  }
  else {
    for (local_88 = 0; local_88 < (ulong)local_10[1]; local_88 = local_88 + 1) {
      local_80 = local_10[6];
      local_78 = local_88 * local_10[6];
      for (local_90 = 0; local_90 < (ulong)local_10[6]; local_90 = local_90 + 1) {
        uVar3 = std::isnan((double)(ulong)*(uint *)(*local_10 + (local_90 + local_78) * 4));
        if (((uVar3 & 1) == 0) &&
           (uVar3 = std::isinf((double)(ulong)*(uint *)(*local_10 + (local_90 + local_78) * 4)),
           (uVar3 & 1) == 0)) {
          local_144 = *(float *)(*local_10 + (local_90 + local_78) * 4);
        }
        else {
          local_144 = 0.0;
        }
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 8),local_88);
        *pvVar6 = (double)local_144 + *pvVar6;
        uVar3 = std::isnan((double)(ulong)*(uint *)(*local_10 + (local_90 + local_78) * 4));
        local_145 = 1;
        if ((uVar3 & 1) == 0) {
          iVar4 = std::isinf((double)(ulong)*(uint *)(*local_10 + (local_90 + local_78) * 4));
          local_145 = (byte)iVar4;
        }
        local_80 = local_80 - (ulong)(local_145 & 1);
      }
      fVar2 = (float)local_80;
      fVar1 = (float)(&DAT_006c0110)[local_80 < 0];
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_8 + 8),local_88);
      *pvVar6 = (double)((float)*pvVar6 / (fVar1 + fVar2));
      if (local_80 == 0) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 8),local_88);
        *pvVar6 = NAN;
      }
    }
  }
  if (local_10[2] != 0) {
    this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(long)(int)local_10[4];
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x543861);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (this,in_stack_fffffffffffffe68,(allocator_type *)in_stack_fffffffffffffe60._M_current
              );
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x543887);
    for (local_c8 = 0; local_c8 < (ulong)local_10[5]; local_c8 = local_c8 + 1) {
      __first._M_current = (unsigned_long *)&local_b8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::
      fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffffe60._M_current,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffffe58._M_current,in_stack_fffffffffffffe50);
      local_78 = local_c8 * local_10[6];
      for (local_e8 = 0; local_e8 < (ulong)local_10[6]; local_e8 = local_e8 + 1) {
        if (-1 < *(int *)(local_10[2] + (local_e8 + local_78) * 4)) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_b8,(long)*(int *)(local_10[2] + (local_e8 + local_78) * 4));
          *pvVar7 = *pvVar7 + 1;
        }
      }
      in_stack_fffffffffffffe58._M_current = (double *)&local_b8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)in_stack_fffffffffffffe58._M_current,(difference_type)in_stack_fffffffffffffe50
                 );
      in_stack_fffffffffffffe60._M_current =
           (double *)
           std::
           max_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                     (__first,in_stack_fffffffffffffe60._M_current);
      in_stack_fffffffffffffe50 =
           (int *)std::
                  distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )in_stack_fffffffffffffe60._M_current,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )in_stack_fffffffffffffe58._M_current);
      in_stack_fffffffffffffe4c = (value_type)in_stack_fffffffffffffe50;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 0xb),local_c8);
      *pvVar8 = in_stack_fffffffffffffe4c;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffe60._M_current);
  }
  return;
}

Assistant:

void initialize_imputer(Imputer &imputer, InputData &input_data, size_t ntrees, int nthreads)
{
    imputer.ncols_numeric  =  input_data.ncols_numeric;
    imputer.ncols_categ    =  input_data.ncols_categ;
    imputer.ncat.assign(input_data.ncat, input_data.ncat + input_data.ncols_categ);
    if (imputer.col_means.size())
    {
        imputer.col_means.resize(input_data.ncols_numeric);
        std::fill(imputer.col_means.begin(), imputer.col_means.end(), 0);
    }

    else
    {
        imputer.col_means.resize(input_data.ncols_numeric, 0);
    }

    imputer.col_modes.resize(input_data.ncols_categ);
    imputer.imputer_tree = std::vector<std::vector<ImputeNode>>(ntrees);

    /* TODO: here should use sample weights if specified as density */
    size_t offset, cnt;
    if (input_data.numeric_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) private(cnt, offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt    = input_data.nrows;
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.numeric_data[row + offset]))?
                                           input_data.numeric_data[row + offset] : 0;
                cnt -= is_na_or_inf(input_data.numeric_data[row + offset]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    else if (input_data.Xc_indptr != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) private(cnt) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt = input_data.nrows;
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.Xc[ix]))?
                                           input_data.Xc[ix] : 0;
                cnt -= is_na_or_inf(input_data.Xc[ix]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    if (input_data.categ_data != NULL)
    {
        std::vector<size_t> cat_counts(input_data.max_categ);
        #pragma omp parallel for schedule(static) num_threads(nthreads) firstprivate(cat_counts) private(offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_categ; col++)
        {
            std::fill(cat_counts.begin(), cat_counts.end(), 0);
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                if (input_data.categ_data[row + offset] >= 0)
                    cat_counts[input_data.categ_data[row + offset]]++;
            }
            imputer.col_modes[col] = (int) std::distance(cat_counts.begin(),
                                                         std::max_element(cat_counts.begin(),
                                                                           cat_counts.begin() + input_data.ncat[col]));
        }
    }
}